

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall t_dart_generator::generate_dart_library(t_dart_generator *this)

{
  pointer pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  long *plVar5;
  _func_int **pp_Var6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_library_name;
  ofstream_with_content_based_conditional_update f_library;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  char *local_210;
  undefined8 local_208;
  char local_200 [16];
  long *local_1f0 [2];
  long local_1e0 [2];
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  local_208 = 0;
  local_200[0] = '\0';
  local_210 = local_200;
  if ((this->library_prefix_)._M_string_length == 0) {
    pcVar1 = (this->base_dir_)._M_dataplus._M_p;
    local_230 = &local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar1,pcVar1 + (this->base_dir_)._M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_230,(ulong)(this->library_name_)._M_dataplus._M_p);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_240 = *plVar5;
      lStack_238 = plVar2[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar5;
      local_250 = (long *)*plVar2;
    }
    local_248 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    pp_Var6 = (_func_int **)(puVar3 + 2);
    if ((_func_int **)*puVar3 == pp_Var6) {
      local_1c0 = *pp_Var6;
      lStack_1b8 = puVar3[3];
      local_1d0._0_8_ = &local_1c0;
    }
    else {
      local_1c0 = *pp_Var6;
      local_1d0._0_8_ = (_func_int **)*puVar3;
    }
    local_1d0._8_8_ = puVar3[1];
    *puVar3 = pp_Var6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_210,(string *)local_1d0);
    if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    local_1f0[0] = local_230;
    if (local_230 == &local_220) goto LAB_001b2fa1;
  }
  else {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_1f0,this);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_1f0);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_220 = *plVar5;
      lStack_218 = plVar2[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*plVar2;
    }
    local_228 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_230,(ulong)(this->library_name_)._M_dataplus._M_p);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_240 = *plVar2;
      lStack_238 = puVar3[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar2;
      local_250 = (long *)*puVar3;
    }
    local_248 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
    pp_Var6 = (_func_int **)(plVar2 + 2);
    if ((_func_int **)*plVar2 == pp_Var6) {
      local_1c0 = *pp_Var6;
      lStack_1b8 = plVar2[3];
      local_1d0._0_8_ = &local_1c0;
    }
    else {
      local_1c0 = *pp_Var6;
      local_1d0._0_8_ = (_func_int **)*plVar2;
    }
    local_1d0._8_8_ = plVar2[1];
    *plVar2 = (long)pp_Var6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_210,(string *)local_1d0);
    if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_1f0[0] == local_1e0) goto LAB_001b2fa1;
  }
  operator_delete(local_1f0[0]);
LAB_001b2fa1:
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_250,local_210,(allocator *)&local_230);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_250,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"library ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(this->library_prefix_)._M_dataplus._M_p,
                      (this->library_prefix_)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->library_name_)._M_dataplus._M_p,
                      (this->library_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  pcVar7 = (this->library_exports_)._M_dataplus._M_p;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,pcVar7,(this->library_exports_)._M_string_length);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)pcVar7);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_library() {
  string f_library_name;
  if (library_prefix_.empty()) {
    f_library_name = base_dir_ + "/lib/" + library_name_ + ".dart";
  } else {
    f_library_name = get_out_dir() + "/" + library_name_ + ".dart";
  }

  ofstream_with_content_based_conditional_update f_library;
  f_library.open(f_library_name.c_str());

  f_library << autogen_comment() << endl;
  f_library << "library " << library_prefix_ << library_name_ << ";" << endl2;
  f_library << library_exports_;

  f_library.close();
}